

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O3

void Godunov::ComputeAdvectiveVel
               (Box *xbx,Box *ybx,Box *zbx,Array4<double> *u_ad,Array4<double> *v_ad,
               Array4<double> *w_ad,Array4<const_double> *Imx,Array4<const_double> *Imy,
               Array4<const_double> *Imz,Array4<const_double> *Ipx,Array4<const_double> *Ipy,
               Array4<const_double> *Ipz,Array4<const_double> *vel,Array4<const_double> *f,
               Box *domain,Real l_dt,BCRec *pbc,bool l_use_forces_in_trans)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  double *pdVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  double *pdVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  double *pdVar65;
  double *pdVar66;
  double *pdVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  int iVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  double *pdVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  bool bVar98;
  ulong uVar99;
  double dVar100;
  double dVar101;
  double *local_270;
  
  pdVar88 = Ipy->p;
  lVar69 = Ipy->jstride;
  lVar70 = Ipy->kstride;
  lVar80 = Ipy->nstride;
  iVar71 = (Ipy->begin).x;
  iVar4 = (Ipy->begin).y;
  iVar5 = (Ipy->begin).z;
  pdVar45 = Imy->p;
  lVar91 = Imy->jstride;
  lVar94 = Imy->kstride;
  lVar84 = Imy->nstride;
  iVar6 = (Imy->begin).x;
  iVar7 = (Imy->begin).y;
  iVar8 = (Imy->begin).z;
  pdVar46 = f->p;
  lVar47 = f->jstride;
  lVar48 = f->kstride;
  lVar72 = (long)(f->begin).x;
  lVar73 = (long)(f->begin).y;
  lVar74 = (long)(f->begin).z;
  lVar85 = f->nstride;
  pdVar49 = vel->p;
  lVar50 = vel->jstride;
  lVar51 = vel->kstride;
  uVar9 = (vel->begin).x;
  lVar75 = (long)(int)uVar9;
  uVar10 = (vel->begin).y;
  uVar11 = (vel->begin).z;
  lVar52 = vel->nstride;
  pdVar53 = v_ad->p;
  lVar86 = v_ad->jstride;
  lVar95 = v_ad->kstride;
  iVar12 = (v_ad->begin).x;
  iVar13 = (v_ad->begin).y;
  iVar14 = (v_ad->begin).z;
  pdVar54 = Ipz->p;
  lVar55 = Ipz->jstride;
  lVar56 = Ipz->kstride;
  lVar57 = Ipz->nstride;
  iVar15 = (Ipz->begin).x;
  iVar16 = (Ipz->begin).y;
  iVar17 = (Ipz->begin).z;
  pdVar58 = Imz->p;
  lVar59 = Imz->jstride;
  lVar60 = Imz->kstride;
  lVar61 = Imz->nstride;
  iVar18 = (Imz->begin).x;
  iVar19 = (Imz->begin).y;
  iVar20 = (Imz->begin).z;
  pdVar62 = w_ad->p;
  lVar63 = w_ad->jstride;
  lVar64 = w_ad->kstride;
  iVar21 = (w_ad->begin).x;
  iVar22 = (w_ad->begin).y;
  iVar23 = (w_ad->begin).z;
  iVar24 = (domain->smallend).vect[1];
  iVar25 = (domain->smallend).vect[2];
  iVar26 = (domain->bigend).vect[2];
  iVar27 = (domain->bigend).vect[1];
  iVar28 = (xbx->smallend).vect[2];
  iVar29 = (xbx->bigend).vect[2];
  if (iVar28 <= iVar29) {
    lVar90 = Imx->jstride;
    lVar93 = u_ad->jstride;
    iVar30 = (u_ad->begin).y;
    iVar31 = (u_ad->begin).x;
    iVar32 = (Imx->begin).y;
    iVar33 = (Imx->begin).x;
    iVar34 = (Ipx->begin).y;
    iVar35 = (xbx->smallend).vect[1];
    lVar68 = (long)iVar35;
    iVar36 = (xbx->smallend).vect[0];
    lVar3 = (long)iVar36 * 8;
    lVar97 = Ipx->jstride;
    iVar37 = (Ipx->begin).x;
    pdVar65 = Ipx->p;
    lVar82 = Ipx->kstride;
    iVar38 = (Ipx->begin).z;
    pdVar66 = Imx->p;
    lVar81 = Imx->kstride;
    iVar39 = (Imx->begin).z;
    pdVar67 = u_ad->p;
    lVar83 = u_ad->kstride;
    iVar40 = (u_ad->begin).z;
    iVar41 = (domain->bigend).vect[0];
    iVar42 = (domain->smallend).vect[0];
    iVar43 = (xbx->bigend).vect[0];
    iVar44 = (xbx->bigend).vect[1];
    do {
      if (iVar35 <= iVar44) {
        lVar76 = (long)iVar28;
        lVar89 = (long)pdVar67 +
                 (lVar76 - iVar40) * lVar83 * 8 +
                 lVar3 + (lVar68 - iVar30) * lVar93 * 8 + (long)iVar31 * -8;
        lVar92 = (long)pdVar66 +
                 (lVar76 - iVar39) * lVar81 * 8 +
                 lVar3 + (lVar68 - iVar32) * lVar90 * 8 + (long)iVar33 * -8;
        lVar96 = (long)pdVar46 +
                 (lVar76 - lVar74) * lVar48 * 8 +
                 lVar3 + (lVar68 - lVar73) * lVar47 * 8 + lVar72 * -8 + -8;
        lVar87 = (long)pdVar65 +
                 (lVar76 - iVar38) * lVar82 * 8 +
                 lVar3 + (lVar68 - iVar34) * lVar97 * 8 + (long)iVar37 * -8 + -8;
        lVar77 = (int)(iVar28 - uVar11) * lVar51;
        lVar76 = lVar68;
        do {
          if (iVar36 <= iVar43) {
            lVar78 = (lVar76 - (int)uVar10) * lVar50;
            lVar79 = 0;
            do {
              dVar100 = *(double *)(lVar87 + lVar79 * 8);
              dVar101 = *(double *)(lVar92 + lVar79 * 8);
              if (l_use_forces_in_trans) {
                pdVar1 = (double *)(lVar96 + lVar79 * 8);
                dVar100 = dVar100 + *pdVar1 * l_dt * 0.5;
                dVar101 = dVar101 + pdVar1[1] * l_dt * 0.5;
              }
              lVar2 = lVar79 + iVar36;
              if (iVar42 < lVar2) {
                if (iVar41 < lVar2) {
                  switch(pbc->bc[3]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar101 = dVar100;
                    break;
                  case 3:
                    dVar100 = pdVar49[lVar78 + (int)((iVar41 - uVar9) + 1) + lVar77];
                    dVar101 = dVar100;
                    break;
                  case -1:
                    dVar101 = 0.0;
                    dVar100 = 0.0;
                    break;
                  default:
                    goto switchD_003a205b_default;
                  }
                }
              }
              else {
                switch(pbc->bc[0]) {
                case 3:
                  dVar101 = pdVar49[lVar78 + (int)(~uVar9 + iVar42) + lVar77];
                case 1:
                case 2:
                case 4:
                  dVar100 = dVar101;
                  dVar101 = dVar100;
                  break;
                case -1:
                  dVar101 = 0.0;
                  dVar100 = 0.0;
                }
              }
switchD_003a205b_default:
              if (((dVar100 <= 0.0) && (0.0 <= dVar101)) || (ABS(dVar101 + dVar100) < 1e-08)) {
                uVar99 = 0;
              }
              else {
                uVar99 = -(ulong)(0.0 <= dVar101 + dVar100);
                uVar99 = ~uVar99 & (ulong)dVar101 | (ulong)dVar100 & uVar99;
              }
              *(ulong *)(lVar89 + lVar79 * 8) = uVar99;
              lVar79 = lVar79 + 1;
            } while ((iVar43 - iVar36) + 1 != (int)lVar79);
          }
          lVar76 = lVar76 + 1;
          lVar89 = lVar89 + lVar93 * 8;
          lVar92 = lVar92 + lVar90 * 8;
          lVar96 = lVar96 + lVar47 * 8;
          lVar87 = lVar87 + lVar97 * 8;
        } while (iVar44 + 1 != (int)lVar76);
      }
      bVar98 = iVar28 != iVar29;
      iVar28 = iVar28 + 1;
    } while (bVar98);
  }
  iVar28 = (ybx->smallend).vect[2];
  iVar29 = (ybx->bigend).vect[2];
  if (iVar28 <= iVar29) {
    iVar30 = (ybx->smallend).vect[1];
    lVar90 = (long)iVar30;
    iVar31 = (ybx->smallend).vect[0];
    lVar93 = (long)iVar31;
    lVar3 = lVar85 * 8;
    iVar32 = (ybx->bigend).vect[0];
    iVar33 = (ybx->bigend).vect[1];
    do {
      if (iVar30 <= iVar33) {
        lVar76 = (long)iVar28;
        lVar82 = (lVar76 - lVar74) * lVar48 * 8;
        lVar97 = (long)pdVar46 +
                 lVar82 + lVar3 + (lVar90 - lVar73) * lVar47 * 8 + lVar93 * 8 + lVar72 * -8;
        lVar83 = (long)pdVar46 +
                 lVar82 + lVar3 + ((lVar90 + -1) - lVar73) * lVar47 * 8 + lVar93 * 8 + lVar72 * -8;
        lVar77 = (lVar76 - (int)uVar11) * lVar51 * 8;
        lVar68 = (long)pdVar53 +
                 (lVar76 - iVar14) * lVar95 * 8 +
                 lVar93 * 8 + (lVar90 - iVar13) * lVar86 * 8 + (long)iVar12 * -8;
        lVar81 = (long)pdVar45 +
                 (lVar76 - iVar8) * lVar94 * 8 +
                 lVar84 * 8 + (lVar90 - iVar7) * lVar91 * 8 + lVar93 * 8 + (long)iVar6 * -8;
        lVar76 = (long)pdVar88 +
                 (lVar76 - iVar5) * lVar70 * 8 +
                 lVar80 * 8 + ((lVar90 - iVar4) + -1) * lVar69 * 8 + lVar93 * 8 + (long)iVar71 * -8;
        lVar82 = lVar90;
        do {
          if (iVar31 <= iVar32) {
            lVar87 = 0;
            do {
              dVar101 = *(double *)(lVar76 + lVar87 * 8);
              dVar100 = *(double *)(lVar81 + lVar87 * 8);
              if (l_use_forces_in_trans) {
                dVar101 = dVar101 + *(double *)(lVar83 + lVar87 * 8) * l_dt * 0.5;
                dVar100 = dVar100 + *(double *)(lVar97 + lVar87 * 8) * l_dt * 0.5;
              }
              if (iVar24 < lVar82) {
                if (iVar27 < lVar82) {
                  switch(pbc[1].bc[4]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar100 = dVar101;
                    break;
                  case 3:
                    dVar100 = *(double *)
                               ((long)pdVar49 +
                               lVar87 * 8 +
                               lVar77 + lVar52 * 8 + (int)((iVar27 - uVar10) + 1) * lVar50 * 8 +
                                        lVar93 * 8 + lVar75 * -8);
                    goto switchD_003a253a_caseD_1;
                  case -1:
                    goto switchD_003a2515_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[1].bc[1]) {
                case 3:
                  dVar100 = *(double *)
                             ((long)pdVar49 +
                             lVar87 * 8 +
                             lVar77 + lVar52 * 8 + (int)(~uVar10 + iVar24) * lVar50 * 8 + lVar93 * 8
                                      + lVar75 * -8);
                case 1:
                case 2:
                case 4:
switchD_003a253a_caseD_1:
                  dVar101 = dVar100;
                  break;
                case -1:
switchD_003a2515_caseD_ffffffff:
                  dVar100 = 0.0;
                  dVar101 = 0.0;
                }
              }
              if (((dVar101 <= 0.0) && (0.0 <= dVar100)) || (ABS(dVar100 + dVar101) < 1e-08)) {
                uVar99 = 0;
              }
              else {
                uVar99 = -(ulong)(0.0 <= dVar100 + dVar101);
                uVar99 = ~uVar99 & (ulong)dVar100 | (ulong)dVar101 & uVar99;
              }
              *(ulong *)(lVar68 + lVar87 * 8) = uVar99;
              lVar87 = lVar87 + 1;
            } while ((iVar32 - iVar31) + 1 != (int)lVar87);
          }
          lVar82 = lVar82 + 1;
          lVar97 = lVar97 + lVar47 * 8;
          lVar83 = lVar83 + lVar47 * 8;
          lVar68 = lVar68 + lVar86 * 8;
          lVar81 = lVar81 + lVar91 * 8;
          lVar76 = lVar76 + lVar69 * 8;
        } while (iVar33 + 1 != (int)lVar82);
      }
      bVar98 = iVar28 != iVar29;
      iVar28 = iVar28 + 1;
    } while (bVar98);
  }
  iVar71 = (zbx->smallend).vect[2];
  iVar4 = (zbx->bigend).vect[2];
  if (iVar71 <= iVar4) {
    iVar6 = (zbx->smallend).vect[1];
    lVar91 = (long)iVar6;
    iVar7 = (zbx->smallend).vect[0];
    lVar80 = (long)iVar7;
    lVar69 = lVar85 * 0x10 + (lVar91 - lVar73) * lVar47 * 8 + lVar80 * 8 + lVar72 * -8;
    lVar70 = (lVar91 - (int)uVar10) * lVar50;
    iVar8 = (zbx->bigend).vect[0];
    iVar12 = (zbx->bigend).vect[1];
    iVar5 = iVar71 + -1;
    do {
      if (iVar6 <= iVar12) {
        lVar94 = (long)iVar71;
        lVar72 = (long)pdVar46 + (-lVar74 + lVar94) * lVar48 * 8 + lVar69;
        lVar86 = (long)pdVar46 + (-lVar74 + (long)iVar5) * lVar48 * 8 + lVar69;
        lVar84 = (long)pdVar62 +
                 (lVar94 - iVar23) * lVar64 * 8 +
                 lVar80 * 8 + (lVar91 - iVar22) * lVar63 * 8 + (long)iVar21 * -8;
        lVar95 = (long)pdVar58 +
                 (lVar94 - iVar20) * lVar60 * 8 +
                 lVar61 * 0x10 + (lVar91 - iVar19) * lVar59 * 8 + lVar80 * 8 + (long)iVar18 * -8;
        lVar85 = (long)pdVar54 +
                 ((long)iVar5 - (long)iVar17) * lVar56 * 8 +
                 lVar57 * 0x10 + (lVar91 - iVar16) * lVar55 * 8 + lVar80 * 8 + (long)iVar15 * -8;
        lVar94 = lVar91;
        pdVar88 = pdVar49 + ((lVar80 + lVar52 * 2 + lVar70 + (int)(~uVar11 + iVar25) * lVar51) -
                            lVar75);
        local_270 = pdVar49 + ((lVar80 + lVar52 * 2 + lVar70 + (int)((iVar26 - uVar11) + 1) * lVar51
                               ) - lVar75);
        do {
          if (iVar7 <= iVar8) {
            lVar73 = 0;
            do {
              dVar101 = *(double *)(lVar85 + lVar73 * 8);
              dVar100 = *(double *)(lVar95 + lVar73 * 8);
              if (l_use_forces_in_trans) {
                dVar101 = dVar101 + *(double *)(lVar86 + lVar73 * 8) * l_dt * 0.5;
                dVar100 = dVar100 + *(double *)(lVar72 + lVar73 * 8) * l_dt * 0.5;
              }
              if (iVar25 < iVar71) {
                if (iVar26 < iVar71) {
                  switch(pbc[2].bc[5]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar100 = dVar101;
                    break;
                  case 3:
                    dVar100 = local_270[lVar73];
                    dVar101 = dVar100;
                    break;
                  case -1:
                    dVar100 = 0.0;
                    dVar101 = 0.0;
                    break;
                  default:
                    goto switchD_003a295c_default;
                  }
                }
              }
              else {
                switch(pbc[2].bc[2]) {
                case 3:
                  dVar100 = pdVar88[lVar73];
                case 1:
                case 2:
                case 4:
                  dVar101 = dVar100;
                  break;
                case -1:
                  dVar100 = 0.0;
                  dVar101 = 0.0;
                }
              }
switchD_003a295c_default:
              if (((dVar101 <= 0.0) && (0.0 <= dVar100)) || (ABS(dVar100 + dVar101) < 1e-08)) {
                uVar99 = 0;
              }
              else {
                uVar99 = -(ulong)(0.0 <= dVar100 + dVar101);
                uVar99 = ~uVar99 & (ulong)dVar100 | (ulong)dVar101 & uVar99;
              }
              *(ulong *)(lVar84 + lVar73 * 8) = uVar99;
              lVar73 = lVar73 + 1;
            } while ((iVar8 - iVar7) + 1 != (int)lVar73);
          }
          lVar94 = lVar94 + 1;
          lVar72 = lVar72 + lVar47 * 8;
          lVar86 = lVar86 + lVar47 * 8;
          local_270 = local_270 + lVar50;
          pdVar88 = pdVar88 + lVar50;
          lVar84 = lVar84 + lVar63 * 8;
          lVar95 = lVar95 + lVar59 * 8;
          lVar85 = lVar85 + lVar55 * 8;
        } while (iVar12 + 1 != (int)lVar94);
      }
      iVar5 = iVar5 + 1;
      bVar98 = iVar71 != iVar4;
      iVar71 = iVar71 + 1;
    } while (bVar98);
  }
  return;
}

Assistant:

void
Godunov::ComputeAdvectiveVel ( Box const& xbx,
                               Box const& ybx,
                               Box const& zbx,
                               Array4<Real> const& u_ad,
                               Array4<Real> const& v_ad,
                               Array4<Real> const& w_ad,
                               Array4<Real const> const& Imx,
                               Array4<Real const> const& Imy,
                               Array4<Real const> const& Imz,
                               Array4<Real const> const& Ipx,
                               Array4<Real const> const& Ipy,
                               Array4<Real const> const& Ipz,
                               Array4<Real const> const& vel,
                               Array4<Real const> const& f,
                               const Box& domain,
                               Real l_dt,
                               BCRec  const* pbc,
                               bool l_use_forces_in_trans)
{
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    amrex::ParallelFor(AMREX_D_DECL(xbx, ybx, zbx),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about x-velocity on x-faces here
        constexpr int n = 0;

        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, vel, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        u_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about y-velocity on y-faces here
        constexpr int n = 1;

        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, vel, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        v_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about z-velocity on z-faces here
        constexpr int n = 2;

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, vel, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        w_ad(i,j,k) = ltm ? 0. : st;
    }
    );
}